

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

void google::protobuf::uint128::DivModImpl
               (uint128 dividend,uint128 divisor,uint128 *quotient_ret,uint128 *remainder_ret)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  protobuf *ppVar4;
  ulong uVar5;
  protobuf *this;
  ulong uVar7;
  uint64 uVar8;
  bool bVar9;
  uint128 n;
  uint128 uVar10;
  LogFinisher local_89;
  uint128 *local_88;
  uint128 *local_80;
  uint128 divisor_local;
  LogMessage local_68;
  uint64 extraout_RDX;
  ulong uVar6;
  
  n.lo_ = dividend.hi_;
  this = (protobuf *)dividend.lo_;
  uVar5 = divisor.hi_;
  n.hi_ = (protobuf *)divisor.lo_;
  divisor_local.lo_ = (uint64)n.hi_;
  divisor_local.hi_ = uVar5;
  if (n.hi_ == (protobuf *)0x0 && uVar5 == 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/int128.cc"
               ,0x54);
    pLVar3 = internal::LogMessage::operator<<(&local_68,"Division or mod by zero: dividend.hi=");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,n.lo_);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,", lo=");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,(unsigned_long)this);
    internal::LogFinisher::operator=(&local_89,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
  }
  else {
    bVar9 = n.lo_ < uVar5;
    if (n.lo_ == uVar5) {
      bVar9 = this < n.hi_;
    }
    if (bVar9) {
      quotient_ret->lo_ = 0;
      quotient_ret->hi_ = 0;
      remainder_ret->lo_ = (uint64)this;
      remainder_ret->hi_ = n.lo_;
    }
    else {
      local_88 = quotient_ret;
      local_80 = remainder_ret;
      iVar1 = Fls128(this,n);
      uVar10.hi_ = extraout_RDX;
      uVar10.lo_ = uVar5;
      iVar2 = Fls128(n.hi_,uVar10);
      uVar8 = 0;
      uVar5 = 0;
      for (iVar1 = iVar1 - iVar2; -1 < iVar1; iVar1 = iVar1 + -1) {
        uVar7 = uVar5 * 2;
        uVar10 = protobuf::operator<<(&divisor_local,iVar1);
        uVar6 = uVar10.hi_;
        ppVar4 = (protobuf *)uVar10.lo_;
        bVar9 = uVar6 <= n.lo_;
        if (n.lo_ == uVar6) {
          bVar9 = ppVar4 <= this;
        }
        if (bVar9) {
          bVar9 = this < ppVar4;
          this = this + -(long)ppVar4;
          n.lo_ = (n.lo_ - uVar6) - (ulong)bVar9;
          uVar7 = uVar7 | 1;
        }
        uVar8 = uVar8 << 1 | uVar5 >> 0x3f;
        uVar5 = uVar7;
      }
      local_88->lo_ = uVar5;
      local_88->hi_ = uVar8;
      local_80->lo_ = (uint64)this;
      local_80->hi_ = n.lo_;
    }
  }
  return;
}

Assistant:

void uint128::DivModImpl(uint128 dividend, uint128 divisor,
                         uint128* quotient_ret, uint128* remainder_ret) {
  if (divisor == 0) {
    GOOGLE_LOG(FATAL) << "Division or mod by zero: dividend.hi=" << dividend.hi_
                      << ", lo=" << dividend.lo_;
  } else if (dividend < divisor) {
    *quotient_ret = 0;
    *remainder_ret = dividend;
    return;
  } else {
    int dividend_bit_length = Fls128(dividend);
    int divisor_bit_length = Fls128(divisor);
    int difference = dividend_bit_length - divisor_bit_length;
    uint128 quotient = 0;
    while (difference >= 0) {
      quotient <<= 1;
      uint128 shifted_divisor = divisor << difference;
      if (shifted_divisor <= dividend) {
        dividend -= shifted_divisor;
        quotient += 1;
      }
      difference -= 1;
    }
    //record the final quotient and remainder
    *quotient_ret = quotient;
    *remainder_ret = dividend;
  }
}